

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArraySamplingTest::logLinkingLog
          (TextureCubeMapArraySamplingTest *this,programDefinition *info)

{
  ostringstream *this_00;
  string info_log;
  string local_1b0;
  undefined1 local_190 [384];
  
  if (info->m_program_object_id != 0) {
    TestCaseBase::getLinkingInfoLog_abi_cxx11_
              (&local_1b0,&this->super_TestCaseBase,info->m_program_object_id);
    local_190._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Program linking failure:\n\n");
    std::operator<<((ostream *)this_00,(string *)&local_1b0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  return;
}

Assistant:

glw::GLuint TextureCubeMapArraySamplingTest::programDefinition::getProgramId() const
{
	return m_program_object_id;
}